

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAMCoupe.cpp
# Opt level: O0

bool SetDiskInfo(uint8_t pb_,MGT_DISK_INFO *di)

{
  SamDosType SVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long lVar5;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string strPaddedLabel_1;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string strPaddedLabel;
  bool modified;
  MGT_DIR *p;
  MGT_DISK_INFO *di_local;
  uint8_t pb__local;
  
  uVar2 = (ulong)pb_;
  strPaddedLabel.field_2._M_local_buf[0xf] = '\0';
  SVar1 = di->dos_type;
  if (SVar1 == SAMDOS) {
    uVar3 = std::__cxx11::string::empty();
    if ((((uVar3 & 1) != 0) || (opt.fix == 0)) || (opt.nosig != 0)) goto LAB_0022243c;
    *(undefined4 *)(uVar2 + 0xe8) = 0x534f4442;
    di->dos_type = BDOS;
    strPaddedLabel.field_2._M_local_buf[0xf] = '\x01';
  }
  else {
    if (SVar1 == MasterDOS) {
      *(char *)(uVar2 + 0xfc) = (char)((uint)di->serial_number >> 8);
      *(char *)(uVar2 + 0xfd) = (char)di->serial_number;
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,10,' ',&local_69);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,&di->disk_label,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
        std::allocator<char>::~allocator(&local_69);
        puVar4 = (undefined8 *)std::__cxx11::string::data();
        *(undefined8 *)(uVar2 + 0xd2) = *puVar4;
        *(undefined2 *)(uVar2 + 0xda) = *(undefined2 *)(puVar4 + 1);
        std::__cxx11::string::~string((string *)local_48);
      }
      else {
        *(undefined1 *)(uVar2 + 0xd2) = 0x2a;
        memset((void *)(uVar2 + 0xd3),0x20,9);
      }
      goto LAB_0022243c;
    }
    if (SVar1 != BDOS) goto LAB_0022243c;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,0x10,' ',&local_c1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                 &di->disk_label,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  puVar4 = (undefined8 *)std::__cxx11::string::data();
  *(undefined8 *)(uVar2 + 0xd2) = *puVar4;
  *(undefined2 *)(uVar2 + 0xda) = *(undefined2 *)(puVar4 + 1);
  lVar5 = std::__cxx11::string::data();
  *(undefined4 *)(uVar2 + 0xfa) = *(undefined4 *)(lVar5 + 10);
  *(undefined2 *)(uVar2 + 0xfe) = *(undefined2 *)(lVar5 + 0xe);
  std::__cxx11::string::~string((string *)local_a0);
LAB_0022243c:
  return (bool)(strPaddedLabel.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool SetDiskInfo(uint8_t pb_, MGT_DISK_INFO& di)
{
    auto p = reinterpret_cast<MGT_DIR*>(pb_);
    auto modified = false;

    // Extract the remaining disk information from type-specific locations
    switch (di.dos_type)
    {
    case SamDosType::MasterDOS:
        // Set serial number
        p->extra.abSerial[0] = static_cast<uint8_t>(di.serial_number >> 8);
        p->extra.abSerial[1] = static_cast<uint8_t>(di.serial_number);

        // No label?
        if (di.disk_label.empty())
        {
            p->abLabel[0] = '*';
            memset(p->abLabel + 1, ' ', sizeof(p->abLabel) - 1);
        }
        else
        {
            std::string strPaddedLabel = di.disk_label + std::string(sizeof(p->abLabel), ' ');
            memcpy(p->abLabel, strPaddedLabel.data(), sizeof(p->abLabel));
        }
        break;

    case SamDosType::SAMDOS:
        // Leave as SAMDOS format if there's no label, or we're not allowed to write a BDOS signature
        if (di.disk_label.empty() || opt.fix == 0 || opt.nosig)
            break;

        // Convert to BDOS format
        memcpy(p->abBDOS, "BDOS", 4);
        di.dos_type = SamDosType::BDOS;
        modified = true;

        // fall through...

    case SamDosType::BDOS:
    {
        // Form space-padded version of the label
        std::string strPaddedLabel = di.disk_label + std::string(BDOS_LABEL_SIZE, ' ');

        // Split across the two locations used
        memcpy(p->abLabel, strPaddedLabel.data(), sizeof(p->abLabel));
        memcpy(&p->extra.bDirTag, strPaddedLabel.data() + sizeof(p->abLabel), 6);   // last 6 characters
        break;
    }
    }

    return modified;
}